

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall HdlcAnalyzer::BitSyncProcessFlags(HdlcAnalyzer *this)

{
  bool bVar1;
  byte bVar2;
  BitState BVar3;
  U64 UVar4;
  long lVar5;
  size_type sVar6;
  reference pvVar7;
  U8 mType;
  undefined1 local_d8 [8];
  Frame frame_1;
  uint local_ac;
  undefined1 auStack_a8 [4];
  U32 i_1;
  HdlcByte bs;
  pointer puStack_88;
  pointer local_80;
  BitState BStack_78;
  U32 UStack_74;
  bool local_70;
  bool bStack_6f;
  undefined1 local_68 [8];
  Frame frame;
  uint local_40;
  U32 i;
  undefined1 local_30 [8];
  vector<HdlcByte,_std::allocator<HdlcByte>_> flags;
  bool flagEncountered;
  HdlcAnalyzer *this_local;
  
  flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::vector
            ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30);
  while( true ) {
    bVar1 = AbortComing(this);
    mType = (U8)this;
    if (bVar1) break;
    bVar1 = FlagComing(this);
    if (bVar1) {
      bs.endSample._0_1_ = 0;
      _auStack_a8 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      bs.startSample = AnalyzerChannelData::GetSampleNumber();
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::push_back
                ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30,(value_type *)auStack_a8);
      bVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mHdlc);
      if ((bVar2 & 1) == 0) {
        AnalyzerChannelData::Advance((uint)this->mHdlc);
        BVar3 = AnalyzerChannelData::GetBitState();
        this->mPreviousBitState = BVar3;
        AnalyzerChannelData::Advance((uint)this->mHdlc);
      }
      else {
        AnalyzerChannelData::Advance((uint)this->mHdlc);
        BVar3 = AnalyzerChannelData::GetBitState();
        this->mPreviousBitState = BVar3;
        AnalyzerChannelData::AdvanceToNextEdge();
      }
      flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._7_1_ = 1;
    }
    else {
      if ((flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) goto LAB_00117cd8;
      AnalyzerChannelData::AdvanceToNextEdge();
    }
  }
  for (local_40 = 0;
      sVar6 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::size
                        ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30), local_40 < sVar6;
      local_40 = local_40 + 1) {
    pvVar7 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at
                       ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30,(ulong)local_40);
    UVar4 = pvVar7->startSample;
    pvVar7 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at
                       ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30,(ulong)local_40);
    CreateFrame((HdlcAnalyzer *)local_68,mType,0,UVar4,pvVar7->endSample,2,'\0');
    AddFrameToResults(this,(Frame *)local_68);
    Frame::~Frame((Frame *)local_68);
  }
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::clear
            ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30);
  UVar4 = AnalyzerChannelData::GetSampleNumber();
  lVar5 = AnalyzerChannelData::GetSampleNumber();
  CreateFrame((HdlcAnalyzer *)&bs.value,mType,7,UVar4,lVar5 + (ulong)this->mSamplesIn8Bits,0,'\0');
  this->field_0xb8 = local_70;
  this->field_0xb9 = bStack_6f;
  *(pointer *)&this->field_0xa8 = local_80;
  *(BitState *)&this->field_0xb0 = BStack_78;
  *(U32 *)&this->field_0xb4 = UStack_74;
  this->mAbtFrame = (Frame)bs.value;
  this->field_0x99 = bs.escaped;
  *(undefined6 *)&this->field_0x9a = bs._18_6_;
  *(pointer *)&this->field_0xa0 = puStack_88;
  Frame::~Frame((Frame *)&bs.value);
  AnalyzerChannelData::AdvanceToNextEdge();
  flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  this->mAbortFrame = true;
LAB_00117cd8:
  if ((this->mAbortFrame & 1U) == 0) {
    for (local_ac = 0;
        sVar6 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::size
                          ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30),
        local_ac < sVar6; local_ac = local_ac + 1) {
      pvVar7 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at
                         ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30,(ulong)local_ac);
      UVar4 = pvVar7->startSample;
      pvVar7 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at
                         ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30,(ulong)local_ac);
      CreateFrame((HdlcAnalyzer *)local_d8,mType,0,UVar4,pvVar7->endSample,2,'\0');
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::size
                ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30);
      AddFrameToResults(this,(Frame *)local_d8);
      Frame::~Frame((Frame *)local_d8);
    }
  }
  std::vector<HdlcByte,_std::allocator<HdlcByte>_>::~vector
            ((vector<HdlcByte,_std::allocator<HdlcByte>_> *)local_30);
  return;
}

Assistant:

void HdlcAnalyzer::BitSyncProcessFlags()
{
    bool flagEncountered = false;
    vector<HdlcByte> flags;
    for( ;; )
    {
        if( AbortComing() )
        {
            // Show fill flags
            for( U32 i = 0; i < flags.size(); ++i )
            {
                Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
                AddFrameToResults( frame );
            }
            flags.clear();

            mAbtFrame = CreateFrame( HDLC_ABORT_SEQ, mHdlc->GetSampleNumber(), mHdlc->GetSampleNumber() + mSamplesIn8Bits );

            mHdlc->AdvanceToNextEdge();
            flagEncountered = false;
            mAbortFrame = true;

            break;
        }

        if( FlagComing() )
        {
            HdlcByte bs;
            bs.value = 0;

            bs.startSample = mHdlc->GetSampleNumber();
            mHdlc->AdvanceToNextEdge();
            bs.endSample = mHdlc->GetSampleNumber();

            flags.push_back( bs );

            if( mHdlc->WouldAdvancingCauseTransition( mSamplesInHalfPeriod * 1.5 ) )
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->AdvanceToNextEdge();
            }
            else
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
            }

            flagEncountered = true;
        }
        else // non-flag
        {
            if( flagEncountered )
            {
                break;
            }
            else // non-flag byte before a byte-flag is ignored
            {
                mHdlc->AdvanceToNextEdge();
            }
        }
    }

    if( !mAbortFrame )
    {
        for( U32 i = 0; i < flags.size(); ++i )
        {
            Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
            if( i == flags.size() - 1 )
            {
                frame.mData1 = HDLC_FLAG_START;
            }
            AddFrameToResults( frame );
        }
    }
}